

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void ravi_dump_value(lua_State *L,TValue *stack_ptr)

{
  TValue *stack_ptr_local;
  lua_State *L_local;
  
  if (stack_ptr->tt_ == 0x8026) {
    printf("C closure\n");
  }
  else if (stack_ptr->tt_ == 0x16) {
    printf("light C function\n");
  }
  else if ((stack_ptr->tt_ & 0x7f) == 0x46) {
    printf("fast C function\n");
  }
  else if (stack_ptr->tt_ == 0x8006) {
    printf("Lua closure\n");
  }
  else if ((stack_ptr->tt_ & 0xf) == 6) {
    printf("function\n");
  }
  else if (((stack_ptr->tt_ == 0x8014) || (stack_ptr->tt_ == 0x8004)) ||
          ((stack_ptr->tt_ & 0xf) == 4)) {
    if ((stack_ptr->tt_ & 0xf) != 4) {
      __assert_fail("(((((((stack_ptr))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xa4a,"void ravi_dump_value(lua_State *, const TValue *)");
    }
    if ((((stack_ptr->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((stack_ptr)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xa4a,"void ravi_dump_value(lua_State *, const TValue *)");
    }
    printf("\'%s\'\n",(stack_ptr->value_).f + 0x18);
  }
  else if ((stack_ptr->tt_ & 0xf) == 5) {
    printf("table\n");
  }
  else if (stack_ptr->tt_ == 0) {
    printf("nil\n");
  }
  else if (stack_ptr->tt_ == 3) {
    if (stack_ptr->tt_ != 3) {
      __assert_fail("((((stack_ptr))->tt_) == (((3) | ((0) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xa50,"void ravi_dump_value(lua_State *, const TValue *)");
    }
    printf("%.6f\n",(stack_ptr->value_).gc);
  }
  else if (stack_ptr->tt_ == 0x13) {
    if (stack_ptr->tt_ != 0x13) {
      __assert_fail("((((stack_ptr))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xa52,"void ravi_dump_value(lua_State *, const TValue *)");
    }
    printf("%lld\n",(stack_ptr->value_).gc);
  }
  else if (stack_ptr->tt_ == 2) {
    printf("light user data\n");
  }
  else if (stack_ptr->tt_ == 0x8007) {
    printf("full user data\n");
  }
  else if (stack_ptr->tt_ == 1) {
    printf("boolean\n");
  }
  else if (stack_ptr->tt_ == 0x8008) {
    printf("thread\n");
  }
  else {
    printf("other\n");
  }
  return;
}

Assistant:

void ravi_dump_value(lua_State *L, const TValue *stack_ptr) {
  (void)L;
  if (ttisCclosure(stack_ptr))
    printf("C closure\n");
  else if (ttislcf(stack_ptr))
    printf("light C function\n");
  else if (ttisfcf(stack_ptr))
	printf("fast C function\n");
  else if (ttisLclosure(stack_ptr))
    printf("Lua closure\n");
  else if (ttisfunction(stack_ptr))
    printf("function\n");
  else if (ttislngstring(stack_ptr) || ttisshrstring(stack_ptr) ||
    ttisstring(stack_ptr))
    printf("'%s'\n", svalue(stack_ptr));
  else if (ttistable(stack_ptr))
    printf("table\n");
  else if (ttisnil(stack_ptr))
    printf("nil\n");
  else if (ttisfloat(stack_ptr))
    printf("%.6f\n", fltvalue(stack_ptr));
  else if (ttisinteger(stack_ptr))
    printf("%lld\n", (long long)ivalue(stack_ptr));
  else if (ttislightuserdata(stack_ptr))
    printf("light user data\n");
  else if (ttisfulluserdata(stack_ptr))
    printf("full user data\n");
  else if (ttisboolean(stack_ptr))
    printf("boolean\n");
  else if (ttisthread(stack_ptr))
    printf("thread\n");
  else
    printf("other\n");
}